

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::IsInstrInvalidForMemOp(GlobOpt *this,Instr *instr,Loop *loop,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  BasicBlock *pBVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  OpLayoutType OVar6;
  BasicBlock *pBVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  char16 *pcVar10;
  char16 *pcVar11;
  BranchInstr *instr_00;
  uint uVar12;
  char16_t *form;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  pBVar2 = this->currentBlock;
  pBVar7 = Loop::GetHeadBlock(loop);
  if ((((pBVar2 == pBVar7) || (instr->m_kind == InstrKindLabel)) ||
      (instr->m_kind == InstrKindProfiledLabel)) || (bVar3 = IR::Instr::IsRealInstr(instr), !bVar3))
  {
LAB_0044d933:
    bVar3 = OpCodeAttr::FastFldInstr(instr->m_opcode);
    if ((bVar3) ||
       ((instr->m_prev != (Instr *)0x0 &&
        (bVar3 = OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode), bVar3)))) {
      if (DAT_015d346a != '\x01') {
        return true;
      }
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar4,uVar5);
      if (!bVar3) {
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar4,uVar5);
        if (!bVar3) {
          pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
          pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar4,uVar5);
          if (!bVar3) {
            return true;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar9,(wchar (*) [42])local_98);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar10,pcVar11,(ulong)uVar4);
      form = L"Field interaction detected";
    }
    else {
      OVar6 = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
      if (OVar6._value == 0x3b) {
        if (DAT_015d346a != '\x01') {
          return true;
        }
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar4,uVar5);
        if (!bVar3) {
          pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
          pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar4,uVar5);
          if (!bVar3) {
            pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
            pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar4,uVar5);
            if (!bVar3) {
              return true;
            }
          }
        }
        Output::Print(L"TRACE MemOp:");
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar9,(wchar (*) [42])local_98);
        uVar4 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar10,pcVar11,(ulong)uVar4);
        form = L"Slot interaction detected";
      }
      else {
        bVar3 = MayNeedBailOnImplicitCall(instr,src1Val,src2Val);
        if (!bVar3) {
          return false;
        }
        if (DAT_015d346a != '\x01') {
          return true;
        }
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar4,uVar5);
        if (!bVar3) {
          pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
          pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar4,uVar5);
          if (!bVar3) {
            pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
            pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar4,uVar5);
            if (!bVar3) {
              return true;
            }
          }
        }
        Output::Print(L"TRACE MemOp:");
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar9,(wchar (*) [42])local_98);
        uVar4 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar10,pcVar11,(ulong)uVar4);
        form = L"Implicit call bailout detected";
      }
    }
    Output::Print(form);
    if (instr == (Instr *)0x0) goto LAB_0044de5c;
  }
  else {
    uVar12 = instr->m_opcode - 0x1e4;
    if (((uVar12 < 0x2a) && ((0x30000000001U >> ((ulong)uVar12 & 0x3f) & 1) != 0)) ||
       (instr->m_opcode == Ld_A)) goto LAB_0044d933;
    if (instr->m_kind == InstrKindBranch) {
      instr_00 = IR::Instr::AsBranchInstr(instr);
      OVar1 = (instr_00->super_Instr).m_opcode;
      if (OVar1 < ADD) {
        bVar3 = OVar1 == MultiBr || OVar1 == Br;
      }
      else {
        bVar3 = LowererMD::IsUnconditionalBranch(&instr_00->super_Instr);
      }
      if (bVar3 != false) goto LAB_0044d933;
    }
    if (DAT_015d346a != '\x01') {
      return true;
    }
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar4,uVar5);
    if (!bVar3) {
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar4,uVar5);
      if (!bVar3) {
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar4,uVar5);
        if (!bVar3) {
          return true;
        }
      }
    }
    Output::Print(L"TRACE MemOp:");
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar9,(wchar (*) [42])local_98);
    uVar4 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar10,pcVar11,(ulong)uVar4);
    Output::Print(L"Instruction not accepted for memop");
  }
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar10 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar10);
LAB_0044de5c:
  Output::Print(L"\n");
  Output::Flush();
  return true;
}

Assistant:

bool
GlobOpt::IsInstrInvalidForMemOp(IR::Instr *instr, Loop *loop, Value *src1Val, Value *src2Val)
{
    // List of instruction that are valid with memop (ie: instr that gets removed if memop is emitted)
    if (
        this->currentBlock != loop->GetHeadBlock() &&
        !instr->IsLabelInstr() &&
        instr->IsRealInstr() &&
        instr->m_opcode != Js::OpCode::IncrLoopBodyCount &&
        instr->m_opcode != Js::OpCode::StLoopBodyCount &&
        instr->m_opcode != Js::OpCode::Ld_A &&
        instr->m_opcode != Js::OpCode::Ld_I4 &&
        !(instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
    )
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Instruction not accepted for memop"));
        return true;
    }

    // Check prev instr because it could have been added by an optimization and we won't see it here.
    if (OpCodeAttr::FastFldInstr(instr->m_opcode) || (instr->m_prev && OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode)))
    {
        // Refuse any operations interacting with Fields
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Field interaction detected"));
        return true;
    }

    if (Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::ElementSlot)
    {
        // Refuse any operations interacting with slots
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Slot interaction detected"));
        return true;
    }

    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Implicit call bailout detected"));
        return true;
    }

    return false;
}